

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGParseDefine(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlChar *value;
  xmlRelaxNGDefinePtr_conflict userdata;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlHashTablePtr pxVar4;
  void *local_48;
  xmlRelaxNGDefinePtr_conflict prev;
  xmlChar *olddefine;
  xmlRelaxNGDefinePtr_conflict def;
  int tmp;
  int ret;
  xmlChar *name;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  def._4_4_ = 0;
  value = xmlGetProp(node,"name");
  if (value == (xmlChar *)0x0) {
    xmlRngPErr(ctxt,node,0x3f6,"define has no name\n",(xmlChar *)0x0,(xmlChar *)0x0);
  }
  else {
    xmlRelaxNGNormExtSpace(value);
    iVar2 = xmlValidateNCName(value,0);
    if (iVar2 != 0) {
      xmlRngPErr(ctxt,node,0x419,"define name \'%s\' is not an NCName\n",value,(xmlChar *)0x0);
    }
    userdata = xmlRelaxNGNewDefine(ctxt,node);
    if (userdata == (xmlRelaxNGDefinePtr_conflict)0x0) {
      (*xmlFree)(value);
      return -1;
    }
    userdata->type = XML_RELAXNG_DEF;
    userdata->name = value;
    if (node->children == (_xmlNode *)0x0) {
      xmlRngPErr(ctxt,node,0x3f4,"define has no children\n",(xmlChar *)0x0,(xmlChar *)0x0);
    }
    else {
      pxVar1 = ctxt->define;
      ctxt->define = value;
      pxVar3 = xmlRelaxNGParsePatterns(ctxt,node->children,0);
      userdata->content = pxVar3;
      ctxt->define = pxVar1;
    }
    if (ctxt->grammar->defs == (xmlHashTablePtr)0x0) {
      pxVar4 = xmlHashCreate(10);
      ctxt->grammar->defs = pxVar4;
    }
    if (ctxt->grammar->defs == (xmlHashTablePtr)0x0) {
      xmlRngPErr(ctxt,node,0x3f3,"Could not create definition hash\n",(xmlChar *)0x0,(xmlChar *)0x0)
      ;
      def._4_4_ = -1;
    }
    else {
      iVar2 = xmlHashAddEntry(ctxt->grammar->defs,value,userdata);
      if (iVar2 < 0) {
        local_48 = xmlHashLookup(ctxt->grammar->defs,value);
        if (local_48 == (void *)0x0) {
          xmlRngPErr(ctxt,node,0x3f3,"Internal error on define aggregation of %s\n",value,
                     (xmlChar *)0x0);
          def._4_4_ = -1;
        }
        else {
          for (; *(long *)((long)local_48 + 0x58) != 0; local_48 = *(void **)((long)local_48 + 0x58)
              ) {
          }
          *(xmlRelaxNGDefinePtr_conflict *)((long)local_48 + 0x58) = userdata;
        }
      }
    }
  }
  return def._4_4_;
}

Assistant:

static int
xmlRelaxNGParseDefine(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlChar *name;
    int ret = 0, tmp;
    xmlRelaxNGDefinePtr def;
    const xmlChar *olddefine;

    name = xmlGetProp(node, BAD_CAST "name");
    if (name == NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_DEFINE_NAME_MISSING,
                   "define has no name\n", NULL, NULL);
    } else {
        xmlRelaxNGNormExtSpace(name);
        if (xmlValidateNCName(name, 0)) {
            xmlRngPErr(ctxt, node, XML_RNGP_INVALID_DEFINE_NAME,
                       "define name '%s' is not an NCName\n", name, NULL);
        }
        def = xmlRelaxNGNewDefine(ctxt, node);
        if (def == NULL) {
            xmlFree(name);
            return (-1);
        }
        def->type = XML_RELAXNG_DEF;
        def->name = name;
        if (node->children == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_DEFINE_EMPTY,
                       "define has no children\n", NULL, NULL);
        } else {
            olddefine = ctxt->define;
            ctxt->define = name;
            def->content =
                xmlRelaxNGParsePatterns(ctxt, node->children, 0);
            ctxt->define = olddefine;
        }
        if (ctxt->grammar->defs == NULL)
            ctxt->grammar->defs = xmlHashCreate(10);
        if (ctxt->grammar->defs == NULL) {
            xmlRngPErr(ctxt, node, XML_RNGP_DEFINE_CREATE_FAILED,
                       "Could not create definition hash\n", NULL, NULL);
            ret = -1;
        } else {
            tmp = xmlHashAddEntry(ctxt->grammar->defs, name, def);
            if (tmp < 0) {
                xmlRelaxNGDefinePtr prev;

                prev = xmlHashLookup(ctxt->grammar->defs, name);
                if (prev == NULL) {
                    xmlRngPErr(ctxt, node, XML_RNGP_DEFINE_CREATE_FAILED,
                               "Internal error on define aggregation of %s\n",
                               name, NULL);
                    ret = -1;
                } else {
                    while (prev->nextHash != NULL)
                        prev = prev->nextHash;
                    prev->nextHash = def;
                }
            }
        }
    }
    return (ret);
}